

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bf_crc.cc
# Opt level: O2

string * bf_crc::number_to_str_abi_cxx11_(uint64_t v)

{
  ulong in_RSI;
  string_type *in_RDI;
  format f;
  ulong local_108;
  unsigned_long local_100;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  
  if (in_RSI < 1000) {
    boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
              (&local_f8,"%1%");
    boost::io::detail::feed<char,std::char_traits<char>,std::allocator<char>,unsigned_long&>
              (&local_f8,&local_100);
    boost::basic_format<char,std::char_traits<char>,std::allocator<char>>::str_abi_cxx11_
              (in_RDI,&local_f8);
  }
  else if (in_RSI < 1000000) {
    boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
              (&local_f8,"%1%k");
    local_108 = (in_RSI & 0xffffffff) / 1000;
    boost::io::detail::feed<char,std::char_traits<char>,std::allocator<char>,unsigned_long_const&>
              (&local_f8,&local_108);
    boost::basic_format<char,std::char_traits<char>,std::allocator<char>>::str_abi_cxx11_
              (in_RDI,&local_f8);
  }
  else if (in_RSI < 1000000000) {
    boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
              (&local_f8,"%1%M");
    local_108 = (in_RSI & 0xffffffff) / 1000000;
    boost::io::detail::feed<char,std::char_traits<char>,std::allocator<char>,unsigned_long_const&>
              (&local_f8,&local_108);
    boost::basic_format<char,std::char_traits<char>,std::allocator<char>>::str_abi_cxx11_
              (in_RDI,&local_f8);
  }
  else if (in_RSI >> 0xc < 0xe8d4a51) {
    boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
              (&local_f8,"%1%B");
    local_108 = in_RSI / 1000000000;
    boost::io::detail::feed<char,std::char_traits<char>,std::allocator<char>,unsigned_long_const&>
              (&local_f8,&local_108);
    boost::basic_format<char,std::char_traits<char>,std::allocator<char>>::str_abi_cxx11_
              (in_RDI,&local_f8);
  }
  else {
    boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
              (&local_f8,"%1%T");
    local_108 = in_RSI / 1000000000000;
    boost::io::detail::feed<char,std::char_traits<char>,std::allocator<char>,unsigned_long_const&>
              (&local_f8,&local_108);
    boost::basic_format<char,std::char_traits<char>,std::allocator<char>>::str_abi_cxx11_
              (in_RDI,&local_f8);
  }
  boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::~basic_format(&local_f8)
  ;
  return in_RDI;
}

Assistant:

std::string bf_crc::number_to_str(uint64_t v) {
  if(v < 1000) {
    boost::format f("%1%");
    f % v;
    return f.str();
  }
  else if(v < 1000*1000) {
    boost::format f("%1%k");
    f % (v/1000);
    return f.str();
  }
  else if(v < 1000*1000*1000) {
    boost::format f("%1%M");
    f % (v/1000000);
    return f.str();
  }
  else if(v < 1000*1000*1000*1000L) {
    boost::format f("%1%B");
    f % (v/1000000000L);
    return f.str();
  }
  else {
    boost::format f("%1%T");
    f % (v/1000000000000);
    return f.str();
  }
  
}